

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adau1462.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t local_24 [8];
  char buf [8];
  int i;
  char **argv_local;
  int argc_local;
  
  local_24[0] = '\0';
  local_24[1] = '\0';
  local_24[2] = '\0';
  local_24[3] = '\0';
  local_24[4] = '\x01';
  local_24[5] = '\0';
  local_24[6] = '\0';
  local_24[7] = '\0';
  unique0x100001fd = argv;
  printf("ADAU1462 init \n");
  iVar1 = spi_open(argc,stack0xffffffffffffffe8);
  if (iVar1 == 0) {
    default_download_IC_1();
    spi_read(0x2c9,4,local_24);
    printf("init done and read address %x:\n",0x2c9);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    for (; (int)buf._0_4_ < 4; buf._0_4_ = buf._0_4_ + 1) {
      printf(" %.2x",(ulong)(uint)(int)buf[(long)(int)buf._0_4_ + -8]);
    }
    printf("\n");
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    for (; (int)buf._0_4_ < 8; buf._0_4_ = buf._0_4_ + 1) {
      buf[(long)(int)buf._0_4_ + -8] = '\0';
    }
    spi_read(0x2ca,8,local_24);
    printf("init done and read address %x:\n",0x2ca);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    for (; (int)buf._0_4_ < 8; buf._0_4_ = buf._0_4_ + 1) {
      printf(" %.2x",(ulong)(uint)(int)buf[(long)(int)buf._0_4_ + -8]);
    }
    printf("\n");
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    for (; (int)buf._0_4_ < 8; buf._0_4_ = buf._0_4_ + 1) {
      buf[(long)(int)buf._0_4_ + -8] = '\0';
    }
    printf("ADAU1462 Init finish\n");
  }
  else {
    printf("ADAU166 Init failed!!!\n");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	char buf[8] = {0, 0, 0, 0, 1};
	printf("ADAU1462 init \n");
	if(0 != spi_backend_ops.open(argc, argv))
	{
		printf("ADAU166 Init failed!!!\n");
		return 0;
	}
	default_download_IC_1();

	spi_backend_ops.read(DSP_VOLUME_CONTROL_1, 4, buf);
	printf("init done and read address %x:\n",DSP_VOLUME_CONTROL_1);
        for(i = 0; i < 4; i++)
        printf(" %.2x",buf[i]);
        printf("\n");
	
	for(i = 0; i < 8; i++)
                buf[i] = 0;

	spi_backend_ops.read(DSP_VOLUME_CONTROL_2, 8, buf);
        printf("init done and read address %x:\n",DSP_VOLUME_CONTROL_2);
        for(i = 0; i < 8; i++)
        printf(" %.2x",buf[i]);
        printf("\n");

        for(i = 0; i < 8; i++)
                buf[i] = 0;
   printf("ADAU1462 Init finish\n");
   return 0;
}